

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

Abc_Obj_t * Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *pOrigObj)

{
  Flow_Data_t *pFVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  int local_34;
  Abc_Obj_t *pAStack_30;
  int i;
  Abc_Obj_t *pInitObj;
  Abc_Obj_t *pInitFanin;
  Abc_Obj_t *pOrigFanin;
  Abc_Obj_t *pOrigObj_local;
  
  if (pOrigObj == (Abc_Obj_t *)0x0) {
    __assert_fail("pOrigObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x343,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
  }
  iVar2 = Abc_ObjIsPi(pOrigObj);
  if (iVar2 != 0) {
    __assert_fail("!Abc_ObjIsPi(pOrigObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x346,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
  }
  iVar2 = Abc_ObjIsPo(pOrigObj);
  if (iVar2 != 0) {
    __assert_fail("!Abc_ObjIsPo(pOrigObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x347,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
  }
  pFVar1 = pManMR->pDataArray;
  uVar3 = Abc_ObjId(pOrigObj);
  if ((undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x100) ==
      (undefined1  [24])0x0) {
    if ((*(uint *)&pOrigObj->field_0x14 >> 4 & 1) == 0) {
      pAStack_30 = Abc_FlowRetime_CopyNodeToInitNtk(pOrigObj);
      Abc_FlowRetime_SetInitToOrig(pAStack_30,pOrigObj);
      pFVar1 = pManMR->pDataArray;
      uVar3 = Abc_ObjId(pOrigObj);
      pFVar1[uVar3].field_1.pred = pAStack_30;
      *(uint *)&pOrigObj->field_0x14 = *(uint *)&pOrigObj->field_0x14 & 0xffffffef | 0x10;
    }
    else {
      pFVar1 = pManMR->pDataArray;
      uVar3 = Abc_ObjId(pOrigObj);
      pAStack_30 = pFVar1[uVar3].field_1.pred;
    }
    if (pAStack_30 == (Abc_Obj_t *)0x0) {
      __assert_fail("pInitObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x359,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
    }
    if ((*(uint *)&pOrigObj->field_0x14 >> 5 & 1) == 0) {
      for (local_34 = 0; iVar2 = Abc_ObjFaninNum(pOrigObj), local_34 < iVar2;
          local_34 = local_34 + 1) {
        pAVar4 = Abc_ObjFanin(pOrigObj,local_34);
        iVar2 = Abc_ObjIsBo(pAVar4);
        if (iVar2 != 0) {
          __assert_fail("!Abc_ObjIsBo( pOrigFanin )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x362,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
        }
        pAVar4 = Abc_FlowRetime_UpdateBackwardInit_rec(pAVar4);
        Abc_ObjAddFanin(pAStack_30,pAVar4);
      }
      *(uint *)&pOrigObj->field_0x14 = *(uint *)&pOrigObj->field_0x14 & 0xffffffdf | 0x20;
    }
    pOrigObj_local = pAStack_30;
  }
  else {
    pOrigObj_local = (Abc_Obj_t *)0x0;
  }
  return pOrigObj_local;
}

Assistant:

Abc_Obj_t* Abc_FlowRetime_UpdateBackwardInit_rec( Abc_Obj_t *pOrigObj) {
  Abc_Obj_t *pOrigFanin, *pInitFanin, *pInitObj;
  int i;

  assert(pOrigObj);

  // should never reach primary IOs
  assert(!Abc_ObjIsPi(pOrigObj));
  assert(!Abc_ObjIsPo(pOrigObj));

  // skip bias nodes
  if (FTEST(pOrigObj, BIAS_NODE)) 
    return NULL;

  // does an init node already exist?
  if(!pOrigObj->fMarkA) {

    pInitObj = Abc_FlowRetime_CopyNodeToInitNtk( pOrigObj );

    Abc_FlowRetime_SetInitToOrig( pInitObj, pOrigObj );
    FDATA(pOrigObj)->pInitObj = pInitObj;

    pOrigObj->fMarkA = 1;
  } else {
    pInitObj = FDATA(pOrigObj)->pInitObj;
  }
  assert(pInitObj);
    
  // have we already connected this object?
  if (!pOrigObj->fMarkB) {

    // create and/or connect fanins
    Abc_ObjForEachFanin( pOrigObj, pOrigFanin, i ) {
      // should not reach BOs (i.e. the start of the next frame)
      // the new latch bounday should lie before it
      assert(!Abc_ObjIsBo( pOrigFanin ));
      pInitFanin = Abc_FlowRetime_UpdateBackwardInit_rec( pOrigFanin );
      Abc_ObjAddFanin( pInitObj, pInitFanin );
    }

    pOrigObj->fMarkB = 1;
  }

  return pInitObj;
}